

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstatsindex.cpp
# Opt level: O1

bool __thiscall
CoinStatsIndex::CustomRewind(CoinStatsIndex *this,BlockKey *current_tip,BlockKey *new_tip)

{
  int iVar1;
  bool bVar2;
  __uniq_ptr_data<CDBIterator,_std::default_delete<CDBIterator>,_true,_true> this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *key_00;
  char *pcVar3;
  CBlockIndex *index;
  CBlockIndex *pCVar4;
  size_t in_RCX;
  uint uVar5;
  long in_FS_OFFSET;
  Span<const_std::byte> key_01;
  string_view source_file;
  string_view source_file_00;
  Span<const_std::byte> SVar6;
  string_view logging_function;
  string_view logging_function_00;
  char (*in_stack_fffffffffffffe48) [27];
  undefined4 in_stack_fffffffffffffe50;
  int iVar7;
  CoinStatsIndex *this_01;
  CoinStatsIndex *pCVar8;
  string *args_3;
  unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> db_it;
  CDBBatch batch;
  uint8_t obj;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock10;
  DBHeightKey key;
  undefined4 uStack_114;
  pair<uint256,_(anonymous_namespace)::DBVal>_conflict value;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CDBBatch::CDBBatch(&batch,&((this->m_db)._M_t.
                              super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>
                              .super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->
                             super_CDBWrapper);
  this_00.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
  super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
  super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl =
       (__uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>)
       CDBWrapper::NewIterator
                 (&((this->m_db)._M_t.
                    super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>._M_t.
                    super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>.
                    super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->super_CDBWrapper);
  iVar1 = new_tip->height;
  iVar7 = current_tip->height;
  _key = CONCAT44(uStack_114,iVar1);
  value.first.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  db_it._M_t.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
  super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
  super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl =
       (__uniq_ptr_data<CDBIterator,_std::default_delete<CDBIterator>,_true,_true>)
       (__uniq_ptr_data<CDBIterator,_std::default_delete<CDBIterator>,_true,_true>)
       this_00.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
       super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
       super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl;
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::reserve
            ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)&value,0x40);
  DataStream::operator<<((DataStream *)&value,&key);
  SVar6.m_data = (byte *)(value.first.super_base_blob<256U>.m_data._M_elems._0_8_ +
                         value.first.super_base_blob<256U>.m_data._M_elems._24_8_);
  SVar6.m_size = value.first.super_base_blob<256U>.m_data._M_elems._8_8_ - (long)SVar6.m_data;
  CDBIterator::SeekImpl
            ((CDBIterator *)
             this_00.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
             super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
             super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl,SVar6);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&value);
  criticalblock10.super_unique_lock._M_device =
       (mutex_type *)CONCAT44(criticalblock10.super_unique_lock._M_device._4_4_,iVar1);
  bVar2 = iVar7 < iVar1;
  if (iVar1 <= iVar7) {
    args_3 = &(this->super_BaseIndex).m_name;
    bVar2 = false;
    do {
      SVar6 = CDBIterator::GetKeyImpl
                        ((CDBIterator *)
                         this_00.
                         super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
                         super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
                         super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl);
      DataStream::DataStream((DataStream *)&value,SVar6);
      DataStream::read((DataStream *)&value,(int)&obj,(void *)0x1,in_RCX);
      if (obj != 't') {
        pcVar3 = (char *)__cxa_allocate_exception(0x20);
        local_58._M_string_length = std::iostream_category();
        local_58._M_dataplus._M_p._0_4_ = 1;
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar3,(error_code *)"Invalid format for coinstatsindex DB height key");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_008a09d0;
      }
      DataStream::read((DataStream *)&value,(int)&obj,(void *)0x4,in_RCX);
      uVar5 = _obj >> 0x18 | (_obj & 0xff0000) >> 8 | (_obj & 0xff00) << 8 | _obj << 0x18;
      _key = CONCAT44(uStack_114,uVar5);
      std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&value);
      if (uVar5 != (uint)criticalblock10.super_unique_lock._M_device) {
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/coinstatsindex.cpp"
        ;
        source_file._M_len = 0x61;
        logging_function._M_str = "CopyHeightIndexToHashIndex";
        logging_function._M_len = 0x1a;
        LogPrintf_<char[27],std::__cxx11::string,unsigned_char,int>
                  (logging_function,source_file,0xfa,
                   IPC|I2P|VALIDATION|LEVELDB|QT|LIBEVENT|MEMPOOLREJ|PROXY|PRUNE|RAND|ADDRMAN|
                   ESTIMATEFEE|RPC|WALLETDB|MEMPOOL|TOR|NET,(Level)args_3,(char *)&criticalblock10,
                   in_stack_fffffffffffffe48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(iVar7,in_stack_fffffffffffffe50),(uchar *)this,(int *)args_3);
        break;
      }
      memset(&value,0,0xa0);
      SVar6 = CDBIterator::GetValueImpl
                        ((CDBIterator *)
                         this_00.
                         super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
                         super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
                         super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl);
      DataStream::DataStream((DataStream *)&local_58,SVar6);
      key_00 = dbwrapper_private::GetObfuscateKey
                         (*(CDBWrapper **)
                           this_00.
                           super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
                           super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl);
      DataStream::Xor((DataStream *)&local_58,key_00);
      DataStream::read((DataStream *)&local_58,(int)&value,(void *)0x20,in_RCX);
      Unserialize<DataStream,_(anonymous_namespace)::DBVal_&>((DataStream *)&local_58,&value.second)
      ;
      std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_58);
      local_58.field_2._M_local_buf[0] = value.first.super_base_blob<256U>.m_data._M_elems[0x10];
      local_58.field_2._M_local_buf[1] = value.first.super_base_blob<256U>.m_data._M_elems[0x11];
      local_58.field_2._M_local_buf[2] = value.first.super_base_blob<256U>.m_data._M_elems[0x12];
      local_58.field_2._M_local_buf[3] = value.first.super_base_blob<256U>.m_data._M_elems[0x13];
      local_58.field_2._M_local_buf[4] = value.first.super_base_blob<256U>.m_data._M_elems[0x14];
      local_58.field_2._M_local_buf[5] = value.first.super_base_blob<256U>.m_data._M_elems[0x15];
      local_58.field_2._M_local_buf[6] = value.first.super_base_blob<256U>.m_data._M_elems[0x16];
      local_58.field_2._M_local_buf[7] = value.first.super_base_blob<256U>.m_data._M_elems[0x17];
      local_58.field_2._M_local_buf[8] = value.first.super_base_blob<256U>.m_data._M_elems[0x18];
      local_58.field_2._M_local_buf[9] = value.first.super_base_blob<256U>.m_data._M_elems[0x19];
      local_58.field_2._M_local_buf[10] = value.first.super_base_blob<256U>.m_data._M_elems[0x1a];
      local_58.field_2._M_local_buf[0xb] = value.first.super_base_blob<256U>.m_data._M_elems[0x1b];
      local_58.field_2._M_local_buf[0xc] = value.first.super_base_blob<256U>.m_data._M_elems[0x1c];
      local_58.field_2._M_local_buf[0xd] = value.first.super_base_blob<256U>.m_data._M_elems[0x1d];
      local_58.field_2._M_local_buf[0xe] = value.first.super_base_blob<256U>.m_data._M_elems[0x1e];
      local_58.field_2._M_local_buf[0xf] = value.first.super_base_blob<256U>.m_data._M_elems[0x1f];
      local_58._M_dataplus._M_p = (pointer)value.first.super_base_blob<256U>.m_data._M_elems._0_8_;
      local_58._M_string_length._0_1_ = value.first.super_base_blob<256U>.m_data._M_elems[8];
      local_58._M_string_length._1_1_ = value.first.super_base_blob<256U>.m_data._M_elems[9];
      local_58._M_string_length._2_1_ = value.first.super_base_blob<256U>.m_data._M_elems[10];
      local_58._M_string_length._3_1_ = value.first.super_base_blob<256U>.m_data._M_elems[0xb];
      local_58._M_string_length._4_1_ = value.first.super_base_blob<256U>.m_data._M_elems[0xc];
      local_58._M_string_length._5_1_ = value.first.super_base_blob<256U>.m_data._M_elems[0xd];
      local_58._M_string_length._6_1_ = value.first.super_base_blob<256U>.m_data._M_elems[0xe];
      local_58._M_string_length._7_1_ = value.first.super_base_blob<256U>.m_data._M_elems[0xf];
      std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::reserve
                (&batch.ssKey.vch,batch.ssKey.m_read_pos + 0x40);
      std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::reserve
                (&batch.ssValue.vch,batch.ssValue.m_read_pos + 0x400);
      DataStream::operator<<(&batch.ssKey,(DBHashKey *)&local_58);
      Serialize<DataStream,_(anonymous_namespace)::DBVal>(&batch.ssValue,&value.second);
      key_01.m_data =
           batch.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_start + batch.ssKey.m_read_pos;
      key_01.m_size =
           (long)batch.ssKey.vch.
                 super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)key_01.m_data;
      CDBBatch::WriteImpl(&batch,key_01,&batch.ssValue);
      if (batch.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          batch.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        batch.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
        .super__Vector_impl_data._M_finish =
             batch.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      batch.ssKey.m_read_pos = 0;
      if (batch.ssValue.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          batch.ssValue.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        batch.ssValue.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             batch.ssValue.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      batch.ssValue.m_read_pos = 0;
      CDBIterator::Next((CDBIterator *)
                        this_00.
                        super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
                        super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
                        super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl);
      iVar1 = (uint)criticalblock10.super_unique_lock._M_device;
      in_RCX = (size_t)((uint)criticalblock10.super_unique_lock._M_device + 1);
      criticalblock10.super_unique_lock._M_device =
           (mutex_type *)
           CONCAT44(criticalblock10.super_unique_lock._M_device._4_4_,
                    (uint)criticalblock10.super_unique_lock._M_device + 1);
      bVar2 = iVar7 <= iVar1;
    } while (iVar1 < iVar7);
  }
  if ((bVar2) &&
     (bVar2 = CDBWrapper::WriteBatch
                        (&((this->m_db)._M_t.
                           super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>
                           .super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->
                          super_CDBWrapper,&batch,false), bVar2)) {
    criticalblock10.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
    criticalblock10.super_unique_lock._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&criticalblock10.super_unique_lock);
    this_01 = this;
    index = ::node::BlockManager::LookupBlockIndex
                      (((this->super_BaseIndex).m_chainstate)->m_blockman,&current_tip->hash);
    pCVar4 = ::node::BlockManager::LookupBlockIndex
                       (((this->super_BaseIndex).m_chainstate)->m_blockman,&new_tip->hash);
    do {
      value.second.total_unspendable_amount = 0;
      value.second.total_amount = 0;
      value.second.bogo_size = 0;
      value.second.transaction_output_count = 0;
      value.second.muhash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      value.second.muhash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      value.second.muhash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      value.second.muhash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      value.second.muhash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      value.second.muhash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      value.second.muhash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      value.second.muhash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      value.second.muhash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      value.second.muhash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      value.second.muhash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      value.second.muhash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      value.second.muhash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      value.second.muhash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      value.second.muhash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      value.second.muhash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      value.second.muhash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      value.second.muhash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      value.second.muhash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      value.second.muhash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      value.second.muhash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      value.second.muhash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      value.second.muhash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      value.second.muhash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      value.second.muhash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      value.second.muhash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      value.second.muhash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      value.second.muhash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      value.second.muhash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      value.second.muhash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      value.second.muhash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      value.second.muhash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      value.second.total_subsidy = 0;
      value.second.total_prevout_spent_amount._0_3_ = 0;
      pCVar8 = this_01;
      bVar2 = ::node::BlockManager::ReadBlockFromDisk
                        (((this_01->super_BaseIndex).m_chainstate)->m_blockman,(CBlock *)&value,
                         index);
      if (bVar2) {
        bVar2 = ReverseBlock(this_01,(CBlock *)&value,index);
        if (!bVar2) goto LAB_008a0898;
        index = CBlockIndex::GetAncestor(index,index->nHeight + -1);
        bVar2 = true;
      }
      else {
        if (index->phashBlock == (uint256 *)0x0) {
          __assert_fail("phashBlock != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                        ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
        }
        _key = *(undefined8 *)(index->phashBlock->super_base_blob<256U>).m_data._M_elems;
        base_blob<256u>::ToString_abi_cxx11_(&local_58,&key);
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/coinstatsindex.cpp"
        ;
        source_file_00._M_len = 0x61;
        logging_function_00._M_str = "CustomRewind";
        logging_function_00._M_len = 0xc;
        LogPrintf_<char[13],std::__cxx11::string>
                  (logging_function_00,source_file_00,0x124,
                   IPC|I2P|VALIDATION|LEVELDB|QT|LIBEVENT|MEMPOOLREJ|PROXY|PRUNE|RAND|SELECTCOINS|
                   ADDRMAN|WALLETDB|HTTP,0xfbe370,(char *)&local_58,
                   (char (*) [13])in_stack_fffffffffffffe48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(iVar7,in_stack_fffffffffffffe50));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
LAB_008a0898:
        bVar2 = false;
      }
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 *)&value.second.total_amount);
    } while ((bVar2) && (this_01 = pCVar8, pCVar4 != index));
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock10.super_unique_lock);
  }
  else {
    bVar2 = false;
  }
  std::unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_>::~unique_ptr(&db_it);
  CDBBatch::~CDBBatch(&batch);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
LAB_008a09d0:
  __stack_chk_fail();
}

Assistant:

bool CoinStatsIndex::CustomRewind(const interfaces::BlockKey& current_tip, const interfaces::BlockKey& new_tip)
{
    CDBBatch batch(*m_db);
    std::unique_ptr<CDBIterator> db_it(m_db->NewIterator());

    // During a reorg, we need to copy all hash digests for blocks that are
    // getting disconnected from the height index to the hash index so we can
    // still find them when the height index entries are overwritten.
    if (!CopyHeightIndexToHashIndex(*db_it, batch, m_name, new_tip.height, current_tip.height)) {
        return false;
    }

    if (!m_db->WriteBatch(batch)) return false;

    {
        LOCK(cs_main);
        const CBlockIndex* iter_tip{m_chainstate->m_blockman.LookupBlockIndex(current_tip.hash)};
        const CBlockIndex* new_tip_index{m_chainstate->m_blockman.LookupBlockIndex(new_tip.hash)};

        do {
            CBlock block;

            if (!m_chainstate->m_blockman.ReadBlockFromDisk(block, *iter_tip)) {
                LogError("%s: Failed to read block %s from disk\n",
                             __func__, iter_tip->GetBlockHash().ToString());
                return false;
            }

            if (!ReverseBlock(block, iter_tip)) {
                return false; // failure cause logged internally
            }

            iter_tip = iter_tip->GetAncestor(iter_tip->nHeight - 1);
        } while (new_tip_index != iter_tip);
    }

    return true;
}